

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O0

void __thiscall helics::TimeoutMonitor::pingSub(TimeoutMonitor *this,CoreBroker *brk)

{
  bool bVar1;
  GlobalBrokerId id;
  reference pvVar2;
  size_type sVar3;
  long *in_RSI;
  ActionMessage *in_RDI;
  ActionMessage tickf;
  ActionMessage png;
  size_t ii;
  size_t cindex;
  BasicBrokerInfo *brkr;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range1;
  bool activePing;
  time_point now;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffdc8;
  ActionMessage *M;
  BrokerBase *in_stack_fffffffffffffdd0;
  ulong in_stack_fffffffffffffde8;
  action_t startingAction;
  GlobalFederateId local_204;
  BaseType local_200;
  GlobalFederateId local_1fc;
  ActionMessage local_1f8;
  BaseType local_12c;
  BaseType local_128;
  GlobalFederateId local_124;
  BaseType local_120;
  GlobalFederateId local_11c;
  undefined1 local_118 [8];
  BaseType local_110;
  BaseType local_108;
  BaseType local_5c;
  GlobalFederateId local_58;
  BaseType local_54;
  size_type local_50;
  ulong local_48;
  reference local_40;
  BasicBrokerInfo *local_38;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_30;
  long *local_28;
  byte local_19;
  rep local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = std::chrono::_V2::steady_clock::now();
  local_19 = 0;
  local_28 = local_10 + 0x6c;
  local_30._M_current =
       (BasicBrokerInfo *)
       gmlc::containers::
       DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
       ::begin(in_stack_fffffffffffffdc8);
  local_38 = (BasicBrokerInfo *)
             gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
             ::end(in_stack_fffffffffffffdc8);
  do {
    startingAction = (action_t)(in_stack_fffffffffffffde8 >> 0x20);
    bVar1 = __gnu_cxx::
            operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((local_19 & 1) != 0) {
        M = &local_1f8;
        ActionMessage::ActionMessage(in_RDI,startingAction);
        local_200 = (BaseType)
                    std::atomic::operator_cast_to_GlobalBrokerId
                              ((atomic<helics::GlobalBrokerId> *)M);
        GlobalFederateId::GlobalFederateId(&local_1fc,(GlobalBrokerId)local_200);
        local_1f8.dest_id.gid = local_1fc.gid;
        id = std::atomic::operator_cast_to_GlobalBrokerId((atomic<helics::GlobalBrokerId> *)M);
        GlobalFederateId::GlobalFederateId(&local_204,id);
        local_1f8.source_id.gid = local_204.gid;
        local_1f8.messageID = 0x25f;
        setActionFlag<helics::ActionMessage,helics::GeneralFlags>(M,indicator_flag);
        BrokerBase::addActionMessage(in_stack_fffffffffffffdd0,M);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffdd0);
      }
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator*(&local_30);
    local_48 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::size
                         ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
               operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te,local_50);
      local_54 = (local_40->global_id).gid;
      bVar1 = GlobalFederateId::operator==(&pvVar2->connection,(GlobalBrokerId)local_54);
      if (bVar1) {
        local_48 = local_50;
        break;
      }
    }
    in_stack_fffffffffffffde8 = local_48;
    sVar3 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::size
                      ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                       &in_RDI->Te);
    if (in_stack_fffffffffffffde8 == sVar3) {
      std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::emplace_back<>
                ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                 in_stack_fffffffffffffdd0);
      local_5c = (local_40->global_id).gid;
      GlobalFederateId::GlobalFederateId(&local_58,(GlobalBrokerId)local_5c);
      pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
               operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te,local_48);
      (pvVar2->connection).gid = local_58.gid;
      bVar1 = local_40->_disable_ping;
      pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
               operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te,local_48);
      pvVar2->disablePing = (bool)(bVar1 & 1);
    }
    if (local_40->state < ERROR_STATE) {
      pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
               operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te,local_48);
      if ((pvVar2->disablePing & 1U) == 0) {
        in_stack_fffffffffffffdd0 = (BrokerBase *)&in_RDI->Te;
        pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
                 operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                             *)in_stack_fffffffffffffdd0,local_48);
        pvVar2->activeConnection = true;
        pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
                 operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                             *)in_stack_fffffffffffffdd0,local_48);
        pvVar2->waitingForPingReply = true;
        pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
                 operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                             *)in_stack_fffffffffffffdd0,local_48);
        (pvVar2->lastPing).__d.__r = local_18;
        ActionMessage::ActionMessage(in_RDI,(action_t)(in_stack_fffffffffffffde8 >> 0x20));
        local_120 = *(BaseType *)((long)local_10 + 0x14);
        GlobalFederateId::GlobalFederateId(&local_11c,(GlobalBrokerId)local_120);
        local_110 = local_11c.gid;
        local_128 = (local_40->global_id).gid;
        GlobalFederateId::GlobalFederateId(&local_124,(GlobalBrokerId)local_128);
        local_108 = local_124.gid;
        local_12c = (local_40->route).rid;
        (**(code **)(*local_10 + 0x110))(local_10,local_12c,local_118);
        local_19 = 1;
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffdd0);
      }
    }
    else {
      pvVar2 = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
               operator[]((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *
                          )&in_RDI->Te,local_48);
      pvVar2->activeConnection = false;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

void TimeoutMonitor::pingSub(CoreBroker* brk)
{
    auto now = std::chrono::steady_clock::now();
    bool activePing = false;
    for (const auto& brkr : brk->mBrokers) {
        size_t cindex = connections.size();
        for (size_t ii = 0; ii < cindex; ++ii) {
            if (connections[ii].connection == brkr.global_id) {
                cindex = ii;
                break;
            }
        }
        if (cindex == connections.size()) {
            connections.emplace_back();
            connections[cindex].connection = brkr.global_id;
            connections[cindex].disablePing = brkr._disable_ping;
        }

        if (brkr.state < ConnectionState::ERROR_STATE) {
            if (connections[cindex].disablePing) {
                continue;
            }
            connections[cindex].activeConnection = true;
            connections[cindex].waitingForPingReply = true;
            connections[cindex].lastPing = now;
            // send the ping
            ActionMessage png(brkr._core ? CMD_PING : CMD_BROKER_PING);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brkr.global_id;
            brk->transmit(brkr.route, png);
            activePing = true;
        } else {
            connections[cindex].activeConnection = false;
        }
    }
    if (activePing) {
        ActionMessage tickf(CMD_BROKER_CONFIGURE);
        tickf.dest_id = GlobalFederateId(brk->global_id);
        tickf.source_id = GlobalFederateId(brk->global_id);
        tickf.messageID = REQUEST_TICK_FORWARDING;
        setActionFlag(tickf, indicator_flag);
        brk->addActionMessage(tickf);
    }
}